

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_writer.cpp
# Opt level: O1

void __thiscall duckdb::ColumnWriterState::~ColumnWriterState(ColumnWriterState *this)

{
  pointer puVar1;
  
  this->_vptr_ColumnWriterState = (_func_int **)&PTR__ColumnWriterState_004a1028;
  std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
            ((_Bvector_base<std::allocator<bool>_> *)&this->is_empty);
  puVar1 = (this->repetition_levels).super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  puVar1 = (this->definition_levels).super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
    return;
  }
  return;
}

Assistant:

ColumnWriterState::~ColumnWriterState() {
}